

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

Am_Constraint * __thiscall Am_Web::operator_cast_to_Am_Constraint_(Am_Web *this)

{
  Am_Web_Data *this_00;
  Am_Constraint *pAVar1;
  Am_Web_Data *data;
  Am_Web *this_local;
  
  this_00 = (Am_Web_Data *)operator_new(0x70);
  Am_Web_Data::Am_Web_Data(this_00,this->create,this->initialize,this->validate);
  pAVar1 = Am_Web_Data::operator_cast_to_Am_Constraint_(this_00);
  return pAVar1;
}

Assistant:

Am_Web::operator Am_Constraint *()
{
  Am_Web_Data *data = new Am_Web_Data(create, initialize, validate);
  return *data;
}